

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClassSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassSpecifierSyntax,slang::syntax::ClassSpecifierSyntax_const&>
          (BumpAllocator *this,ClassSpecifierSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  ClassSpecifierSyntax *pCVar13;
  
  pCVar13 = (ClassSpecifierSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar5 = (args->colon).kind;
  uVar6 = (args->colon).field_0x2;
  NVar7.raw = (args->colon).numFlags.raw;
  uVar8 = (args->colon).rawLen;
  pIVar3 = (args->colon).info;
  TVar9 = (args->keyword).kind;
  uVar10 = (args->keyword).field_0x2;
  NVar11.raw = (args->keyword).numFlags.raw;
  uVar12 = (args->keyword).rawLen;
  (pCVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pCVar13->super_SyntaxNode).field_0x4 = uVar4;
  (pCVar13->super_SyntaxNode).parent = pSVar1;
  (pCVar13->super_SyntaxNode).previewNode = pSVar2;
  (pCVar13->colon).kind = TVar5;
  (pCVar13->colon).field_0x2 = uVar6;
  (pCVar13->colon).numFlags = (NumericTokenFlags)NVar7.raw;
  (pCVar13->colon).rawLen = uVar8;
  (pCVar13->colon).info = pIVar3;
  (pCVar13->keyword).kind = TVar9;
  (pCVar13->keyword).field_0x2 = uVar10;
  (pCVar13->keyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pCVar13->keyword).rawLen = uVar12;
  (pCVar13->keyword).info = (args->keyword).info;
  return pCVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }